

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_hash_table.hpp
# Opt level: O2

uint64_t __thiscall
poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>::get
          (compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *this,uint64_t key)

{
  uint32_t uVar1;
  bool bVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  ulong slot_id_00;
  uint64_t slot_id;
  
  uVar3 = bijective_hash::split_mix_hasher::hash(&this->hasher_,key);
  uVar1 = (this->capa_size_).bits_;
  slot_id_00 = (this->capa_size_).mask_ & uVar3;
  bVar2 = get_vbit_(this,slot_id_00);
  if (bVar2) {
    slot_id = find_ass_cbit_(this,slot_id_00);
    uVar4 = 0xffffffffffffffff;
    if (slot_id != 0xffffffffffffffff) {
      bVar2 = find_item_(this,&slot_id,uVar3 >> ((ulong)(byte)uVar1 & 0x3f));
      if (bVar2) {
        uVar4 = get_val_(this,slot_id);
      }
    }
  }
  else {
    uVar4 = 0xffffffffffffffff;
  }
  return uVar4;
}

Assistant:

uint64_t get(uint64_t key) const {
        assert(key < univ_size_.size());

        auto [quo, mod] = decompose_(hasher_.hash(key));

        if (!get_vbit_(mod)) {
            return nil;
        }

        uint64_t slot_id = find_ass_cbit_(mod);
        if (slot_id == UINT64_MAX) {
            return nil;
        }

        if (!find_item_(slot_id, quo)) {
            return nil;
        }
        return get_val_(slot_id);
    }